

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

char * ps_get_hyp(ps_decoder_t *ps,int32 *out_best_score)

{
  char *pcVar1;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x562,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    pcVar1 = (char *)0x0;
  }
  else {
    ptmr_start(&ps->perf);
    pcVar1 = (*ps->search->vt->hyp)(ps->search,out_best_score);
    ptmr_stop(&ps->perf);
  }
  return pcVar1;
}

Assistant:

char const *
ps_get_hyp(ps_decoder_t *ps, int32 *out_best_score)
{
    char const *hyp;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return NULL;
    }
    ptmr_start(&ps->perf);
    hyp = ps_search_hyp(ps->search, out_best_score);
    ptmr_stop(&ps->perf);
    return hyp;
}